

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::NewPlaceholderFileWithMutexHeld
          (DescriptorPool *this,StringPiece name)

{
  FileDescriptor *__s;
  string *psVar1;
  FileDescriptorTables *pFVar2;
  
  __s = Tables::Allocate<google::protobuf::FileDescriptor>
                  ((this->tables_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                   _M_head_impl);
  memset(__s,0,0x90);
  psVar1 = Tables::AllocateString_abi_cxx11_
                     ((this->tables_)._M_t.
                      super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                      _M_head_impl,name);
  *(string **)__s = psVar1;
  internal::InitProtobufDefaults();
  *(undefined8 **)(__s + 8) = &internal::fixed_address_empty_string_abi_cxx11_;
  *(DescriptorPool **)(__s + 0x10) = this;
  *(undefined1 **)(__s + 0x78) = _FileOptions_default_instance_;
  pFVar2 = FileDescriptorTables::GetEmptyInstance();
  *(FileDescriptorTables **)(__s + 0x80) = pFVar2;
  *(undefined1 **)(__s + 0x88) = _SourceCodeInfo_default_instance_;
  *(undefined2 *)(__s + 0x38) = 0x101;
  __s[0x3a] = (FileDescriptor)0x0;
  return __s;
}

Assistant:

FileDescriptor* DescriptorPool::NewPlaceholderFileWithMutexHeld(
    StringPiece name) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  FileDescriptor* placeholder = tables_->Allocate<FileDescriptor>();
  memset(static_cast<void*>(placeholder), 0, sizeof(*placeholder));

  placeholder->name_ = tables_->AllocateString(name);
  placeholder->package_ = &internal::GetEmptyString();
  placeholder->pool_ = this;
  placeholder->options_ = &FileOptions::default_instance();
  placeholder->tables_ = &FileDescriptorTables::GetEmptyInstance();
  placeholder->source_code_info_ = &SourceCodeInfo::default_instance();
  placeholder->is_placeholder_ = true;
  placeholder->syntax_ = FileDescriptor::SYNTAX_UNKNOWN;
  placeholder->finished_building_ = true;
  // All other fields are zero or nullptr.

  return placeholder;
}